

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O1

Mat3x3d * __thiscall OpenMD::Atom::getI(Mat3x3d *__return_storage_ptr__,Atom *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  double (*padVar3) [3];
  uint i;
  long lVar4;
  long lVar5;
  uint uVar6;
  SquareMatrix<double,_3> m;
  
  padVar3 = (double (*) [3])&m;
  m.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  m.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar6 = 0x3ff00000;
      if (lVar4 != lVar5) {
        uVar6 = 0;
      }
      ((RectMatrix<double,_3U,_3U> *)*padVar3)->data_[0][lVar5] = (double)((ulong)uVar6 << 0x20);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
    padVar3 = padVar3 + 1;
  } while (lVar4 != 3);
  lVar4 = 0;
  do {
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
            .data_[0] + lVar4 + 0x10) =
         *(undefined8 *)((long)m.super_RectMatrix<double,_3U,_3U>.data_[0] + lVar4 + 0x10);
    uVar2 = *(undefined8 *)((long)m.super_RectMatrix<double,_3U,_3U>.data_[0] + lVar4 + 8);
    puVar1 = (undefined8 *)
             ((long)(__return_storage_ptr__->super_SquareMatrix<double,_3>).
                    super_RectMatrix<double,_3U,_3U>.data_[0] + lVar4);
    *puVar1 = *(undefined8 *)((long)m.super_RectMatrix<double,_3U,_3U>.data_[0] + lVar4);
    puVar1[1] = uVar2;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d Atom::getI() { return Mat3x3d::identity(); }